

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * xmlParseEntityRefInternal(xmlParserCtxtPtr ctxt)

{
  xmlChar *name;
  xmlParserCtxtPtr ctxt_local;
  
  if (((ctxt->input->flags & 0x40U) == 0) &&
     ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlParserGrow(ctxt);
  }
  if (*ctxt->input->cur == '&') {
    xmlNextChar(ctxt);
    ctxt_local = (xmlParserCtxtPtr)xmlParseName(ctxt);
    if (ctxt_local == (xmlParserCtxtPtr)0x0) {
      xmlFatalErrMsg(ctxt,XML_ERR_NAME_REQUIRED,"xmlParseEntityRef: no name\n");
      ctxt_local = (xmlParserCtxtPtr)0x0;
    }
    else if (*ctxt->input->cur == ';') {
      xmlNextChar(ctxt);
    }
    else {
      xmlFatalErr(ctxt,XML_ERR_ENTITYREF_SEMICOL_MISSING,(char *)0x0);
      ctxt_local = (xmlParserCtxtPtr)0x0;
    }
  }
  else {
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  return (xmlChar *)ctxt_local;
}

Assistant:

static const xmlChar *
xmlParseEntityRefInternal(xmlParserCtxtPtr ctxt) {
    const xmlChar *name;

    GROW;

    if (RAW != '&')
        return(NULL);
    NEXT;
    name = xmlParseName(ctxt);
    if (name == NULL) {
	xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
		       "xmlParseEntityRef: no name\n");
        return(NULL);
    }
    if (RAW != ';') {
	xmlFatalErr(ctxt, XML_ERR_ENTITYREF_SEMICOL_MISSING, NULL);
	return(NULL);
    }
    NEXT;

    return(name);
}